

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test>::CreateTest
          (TestFactoryImpl<(anonymous_namespace)::SingleEvaluationTest_FailedEXPECT_THROW_MSG_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x10);
  Test::Test(this_00);
  ::(anonymous_namespace)::SingleEvaluationTest::p_ = "01234";
  ::(anonymous_namespace)::SingleEvaluationTest::a_ = 0;
  ::(anonymous_namespace)::SingleEvaluationTest::b_ = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_001820e0;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }